

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void vocadd2(voccxdef *ctx,prpnum p,objnum objn,int classflg,uchar *wrdtxt,int len,uchar *wrd2,
            int len2)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  vocdef *pvVar4;
  vocdef *pvVar5;
  uint uVar6;
  vocdef *pvVar7;
  
  if (len2 != 0 || len != 0) {
    uVar1 = vochsh(wrdtxt,len);
    pvVar5 = ctx->voccxhsh[uVar1];
    if (pvVar5 != (vocdef *)0x0) {
      do {
        if ((uint)pvVar5->voclen == len) {
          iVar2 = bcmp(wrdtxt,pvVar5->voctxt,(ulong)(uint)len);
          if ((iVar2 == 0) &&
             (((wrd2 == (uchar *)0x0 && (pvVar5->vocln2 == 0)) ||
              (((uint)pvVar5->vocln2 == len2 &&
               (iVar2 = bcmp(wrd2,pvVar5->voctxt + (uint)len,(ulong)(uint)len2), iVar2 == 0)))))) {
            vocwset(ctx,pvVar5,p,objn,classflg);
            return;
          }
        }
        pvVar5 = pvVar5->vocnxt;
      } while (pvVar5 != (vocdef *)0x0);
    }
    uVar6 = len2 + len;
    pvVar5 = (vocdef *)&ctx->voccxfre;
    pvVar4 = (vocdef *)0x0;
    do {
      pvVar7 = pvVar4;
      pvVar5 = pvVar5->vocnxt;
      if (pvVar5 == (vocdef *)0x0) {
        uVar3 = ctx->voccxrem;
        if (uVar3 < uVar6 + 0x17) {
          pvVar5 = (vocdef *)mchalo(ctx->voccxerr,0x2000,"vocadd2");
          uVar3 = 0x2000;
        }
        else {
          pvVar5 = (vocdef *)ctx->voccxpool;
        }
        uVar6 = uVar6 + 0x1e & 0xfffffff8;
        ctx->voccxpool = pvVar5->voctxt + ((ulong)uVar6 - 0x10);
        uVar1 = uVar3 - uVar6;
        if (uVar3 < uVar6) {
          uVar1 = 0;
        }
        ctx->voccxrem = uVar1;
        goto LAB_0021f69f;
      }
      pvVar4 = pvVar5;
    } while (uVar6 != pvVar5->voclen);
    pvVar4 = (vocdef *)&ctx->voccxfre;
    if (pvVar7 != (vocdef *)0x0) {
      pvVar4 = pvVar7;
    }
    pvVar4->vocnxt = pvVar5->vocnxt;
LAB_0021f69f:
    pvVar5->vocwlst = 0xffffffff;
    vocset(ctx,pvVar5,p,objn,classflg,wrdtxt,len,wrd2,len2);
  }
  return;
}

Assistant:

void vocadd2(voccxdef *ctx, prpnum p, objnum objn, int classflg,
             uchar *wrdtxt, int len, uchar *wrd2, int len2)
{
    vocdef  *v;
    vocdef  *prv;
    uint     need;
    uint     hshval;

    /* if the word is null, ignore it entirely */
    if (len == 0 && len2 == 0)
        return;

    /* look for a vocdef entry with the same word text */
    hshval = vochsh(wrdtxt, len);
    for (v = ctx->voccxhsh[hshval] ; v ; v = v->vocnxt)
    {
        /* if it matches on both words, use this entry */
        if (v->voclen == len && !memcmp(wrdtxt, v->voctxt, (size_t)len)
            && ((!wrd2 && v->vocln2 == 0)
                || (v->vocln2 == len2 &&
                    !memcmp(wrd2, v->voctxt + len, (size_t)len2))))
        {
            vocwset(ctx, v, p, objn, classflg);
            return;
        }
    }

    /* look for a free vocdef entry of the same size */
    for (prv = (vocdef *)0, v = ctx->voccxfre ; v ; prv = v, v = v->vocnxt)
        if (v->voclen == len + len2) break;
    
    if (v)
    {
        /* we found something - unlink from free list */
        if (prv) prv->vocnxt = v->vocnxt;
        else ctx->voccxfre = v->vocnxt;
        
        /* reuse the entry */
        v->vocwlst = VOCCXW_NONE;
        vocset(ctx, v, p, objn, classflg, wrdtxt, len, wrd2, len2);
        return;
    }
    
    /* didn't find an existing vocdef; allocate a new one */
    need = sizeof(vocdef) + len + len2 - 1;
    if (ctx->voccxrem < need)
    {
        /* not enough space in current page; allocate a new one */
        ctx->voccxpool = mchalo(ctx->voccxerr, VOCPGSIZ, "vocadd2");
        ctx->voccxrem = VOCPGSIZ;
    }
    
    /* use top of current pool, and update pool pointer and size */
    v = (vocdef *)ctx->voccxpool;
    need = osrndsz(need);
    ctx->voccxpool += need;
    if (ctx->voccxrem > need) ctx->voccxrem -= need;
    else ctx->voccxrem = 0;
    
    /* set up new vocdef */
    v->vocwlst = VOCCXW_NONE;
    vocset(ctx, v, p, objn, classflg, wrdtxt, len, wrd2, len2);
}